

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_type fs_read_symlink(char *path,char *result,size_type buffer_size)

{
  string_view path_00;
  size_type sVar1;
  string_view s;
  char *local_40;
  size_t in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  
  strlen(path);
  path_00._M_str = in_stack_ffffffffffffffd0;
  path_00._M_len = in_stack_ffffffffffffffc8;
  fs_read_symlink_abi_cxx11_(path_00);
  s._M_str = local_40;
  s._M_len = in_stack_ffffffffffffffc8;
  sVar1 = fs_str2char(s,result,buffer_size);
  if (local_40 != &stack0xffffffffffffffd0) {
    operator_delete(local_40,(ulong)(in_stack_ffffffffffffffd0 + 1));
  }
  return sVar1;
}

Assistant:

std::string::size_type fs_read_symlink(const char* path,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_read_symlink(path), result, buffer_size);
}